

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

void qpdfjob_set_logger(qpdfjob_handle j,qpdflogger_handle logger)

{
  shared_ptr<QPDFLogger> local_28;
  qpdflogger_handle local_18;
  qpdflogger_handle logger_local;
  qpdfjob_handle j_local;
  
  local_18 = logger;
  logger_local = (qpdflogger_handle)j;
  std::shared_ptr<QPDFLogger>::shared_ptr(&local_28,&logger->l);
  QPDFJob::setLogger(&j->j,&local_28);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
qpdfjob_set_logger(qpdfjob_handle j, qpdflogger_handle logger)
{
    j->j.setLogger(logger->l);
}